

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Reg3(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  RegSlot R0_00;
  RegSlot R1_00;
  RegSlot R2_00;
  undefined4 *puVar4;
  Type *pTVar5;
  Type TVar6;
  undefined1 local_34 [2];
  OpCode local_32 [3];
  ProfileId profileId;
  OpCode op_local;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x4);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x1b2,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007caa14;
    *puVar4 = 0;
  }
  R0_00 = ConsumeReg(this,R0);
  R1_00 = ConsumeReg(this,R1);
  R2_00 = ConsumeReg(this,R2);
  bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false);
  if (bVar2) {
    if (op != Div_A) {
      if (op == IsIn) goto LAB_007ca91e;
      if (op != Rem_A) goto LAB_007ca94d;
    }
    TVar6 = this->m_functionWrite->profiledDivOrRemCount;
    if (TVar6 == 0xffff) goto LAB_007ca94d;
    pTVar5 = &this->m_functionWrite->profiledDivOrRemCount;
LAB_007ca935:
    *pTVar5 = TVar6 + 1;
    OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
    bVar2 = true;
  }
  else {
    if (op == IsIn) {
LAB_007ca91e:
      TVar6 = this->m_functionWrite->profiledLdElemCount;
      if (TVar6 != 0xffff) {
        pTVar5 = &this->m_functionWrite->profiledLdElemCount;
        goto LAB_007ca935;
      }
    }
LAB_007ca94d:
    bVar2 = false;
  }
  bVar3 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,R0_00,R1_00,R2_00);
  if (!bVar3) {
    bVar3 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,R0_00,R1_00,R2_00);
    if (!bVar3) {
      bVar3 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,op,R0_00,R1_00,R2_00);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x1c6,"(success)","success");
        if (!bVar3) {
LAB_007caa14:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  if (bVar2) {
    Data::Write(&this->m_byteCodeData,local_34,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg3(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        ProfileId profileId = 0;
        bool isProfiled = false;
        if ((DoDynamicProfileOpcode(FloatTypeSpecPhase) && (op == Js::OpCode::Div_A || op == Js::OpCode::Rem_A)) &&
            this->m_functionWrite->AllocProfiledDivOrRem(&profileId))
        {
            isProfiled = true;
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }
        else if (op == Js::OpCode::IsIn && this->m_functionWrite->AllocProfiledLdElemId(&profileId))
        {
            isProfiled = true;
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }

        MULTISIZE_LAYOUT_WRITE(Reg3, op, R0, R1, R2);
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }